

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_meta_dep(CVmImageLoader *this,ulong siz)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  byte *p_00;
  undefined8 uVar10;
  ulong in_RSI;
  undefined8 *in_RDI;
  vm_prop_id_t cur;
  vm_prop_id_t min_prop;
  vm_prop_id_t max_prop;
  ulong prop_start_siz;
  long prop_start_ofs;
  ulong done_size;
  char *p;
  vm_meta_entry_t *entry;
  uint prop_len;
  uint prop_cnt;
  uint len;
  ushort j;
  uint i;
  uint entry_cnt;
  char buf [266];
  undefined4 in_stack_fffffffffffffe68;
  vm_prop_id_t in_stack_fffffffffffffe6c;
  vm_prop_id_t in_stack_fffffffffffffe6e;
  CVmMetaTable *in_stack_fffffffffffffe70;
  CVmMetaTable *func_cnt;
  vm_meta_entry_t *in_stack_fffffffffffffe78;
  CVmImageLoader *in_stack_fffffffffffffe80;
  ushort local_16c;
  ushort local_16a;
  vm_meta_entry_t *in_stack_fffffffffffffeb8;
  uint uVar11;
  undefined2 in_stack_fffffffffffffecc;
  ushort uVar12;
  uint idx;
  byte local_128 [280];
  ulong local_10;
  
  if ((*(byte *)(in_RDI + 0x12) & 1) == 0) {
    *(byte *)(in_RDI + 0x12) = *(byte *)(in_RDI + 0x12) & 0xfe | 1;
    local_10 = in_RSI;
    CVmMetaTable::clear(in_stack_fffffffffffffe70);
    read_data(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
              (size_t)in_stack_fffffffffffffe70,
              (ulong *)CONCAT26(in_stack_fffffffffffffe6e,
                                CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
    uVar4 = ::osrp2(local_128);
    for (idx = 0; idx < uVar4; idx = idx + 1) {
      read_data(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                (size_t)in_stack_fffffffffffffe70,
                (ulong *)CONCAT26(in_stack_fffffffffffffe6e,
                                  CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
      in_stack_fffffffffffffe80 = (CVmImageLoader *)(local_10 + 2);
      iVar5 = ::osrp2(local_128);
      uVar9 = (long)in_stack_fffffffffffffe80 - (long)iVar5;
      read_data(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                (size_t)in_stack_fffffffffffffe70,
                (ulong *)CONCAT26(in_stack_fffffffffffffe6e,
                                  CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
      uVar7 = (uint)local_128[0];
      read_data(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                (size_t)in_stack_fffffffffffffe70,
                (ulong *)CONCAT26(in_stack_fffffffffffffe6e,
                                  CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
      local_128[uVar7] = 0;
      p_00 = local_128 + (ulong)uVar7 + 1;
      uVar11 = uVar7;
      read_data(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                (size_t)in_stack_fffffffffffffe70,
                (ulong *)CONCAT26(in_stack_fffffffffffffe6e,
                                  CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
      uVar6 = ::osrp2(p_00);
      uVar7 = ::osrp2(local_128 + (ulong)uVar7 + 3);
      local_16a = 0;
      local_16c = 0;
      uVar10 = (**(code **)(*(long *)*in_RDI + 0x40))();
      for (uVar12 = 0; uVar12 < uVar6; uVar12 = uVar12 + 1) {
        read_data(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                  (size_t)in_stack_fffffffffffffe70,
                  (ulong *)CONCAT26(in_stack_fffffffffffffe6e,
                                    CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
        if (2 < uVar7) {
          skip_data(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                    (ulong *)in_stack_fffffffffffffe70);
        }
        uVar8 = ::osrp2(p_00);
        uVar3 = (ushort)uVar8;
        uVar1 = uVar3;
        uVar2 = uVar3;
        if (uVar12 != 0) {
          if ((uVar8 & 0xffff) < (uint)local_16c) {
            local_16c = uVar3;
          }
          uVar1 = local_16c;
          uVar2 = local_16a;
          if ((uint)local_16a < (uVar8 & 0xffff)) {
            uVar2 = uVar3;
          }
        }
        local_16a = uVar2;
        local_16c = uVar1;
      }
      CVmMetaTable::add_entry
                ((CVmMetaTable *)CONCAT44(uVar4,idx),
                 (char *)CONCAT26(uVar12,CONCAT24(in_stack_fffffffffffffecc,uVar11)),
                 CONCAT44(uVar6,uVar7),(vm_prop_id_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30),
                 (vm_prop_id_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      in_stack_fffffffffffffeb8 = CVmMetaTable::get_entry(G_meta_table_X,idx);
      (**(code **)(*(long *)*in_RDI + 0x38))((long *)*in_RDI,uVar10);
      for (uVar12 = 1; uVar12 <= uVar6; uVar12 = uVar12 + 1) {
        read_data(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                  (size_t)in_stack_fffffffffffffe70,
                  (ulong *)CONCAT26(in_stack_fffffffffffffe6e,
                                    CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
        if (2 < uVar7) {
          skip_data(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                    (ulong *)in_stack_fffffffffffffe70);
        }
        in_stack_fffffffffffffe78 = in_stack_fffffffffffffeb8;
        in_stack_fffffffffffffeb8 = in_stack_fffffffffffffe78;
        iVar5 = ::osrp2(p_00);
        vm_meta_entry_t::add_prop_xlat(in_stack_fffffffffffffe78,(vm_prop_id_t)iVar5,uVar12);
      }
      if (uVar9 < local_10) {
        skip_data(in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                  (ulong *)in_stack_fffffffffffffe70);
      }
    }
    func_cnt = G_meta_table_X;
    CVmMetaclass::get_reg_idx(CVmObject::metaclass_reg_);
    CVmMetaTable::add_entry_if_new
              ((CVmMetaTable *)in_stack_fffffffffffffe80,
               (uint)((ulong)in_stack_fffffffffffffe78 >> 0x20),(size_t)func_cnt,
               in_stack_fffffffffffffe6e,in_stack_fffffffffffffe6c);
    return;
  }
  err_throw(0);
}

Assistant:

void CVmImageLoader::load_meta_dep(VMG_ ulong siz)
{
    char buf[256 + 10];
    uint entry_cnt;
    uint i;

    /* it's an error if we've already seen a dependency block */
    if (loaded_meta_dep_)
        err_throw(VMERR_IMAGE_METADEP_REDEF);

    /* note that we've loaded a dependency block */
    loaded_meta_dep_ = TRUE;

    /* 
     *   reset the global metaclass table, in case there was anything
     *   defined by a previously-loaded image - since a metaclass's index
     *   in the table is implicit in the load order, we need to make sure
     *   we're starting with a completely clean configuration 
     */
    G_meta_table->clear();
    
    /* read the number of entries in the table */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        ushort j;
        uint len;
        uint prop_cnt;
        uint prop_len;
        vm_meta_entry_t *entry;
        char *p;
        ulong done_size;
        long prop_start_ofs;
        ulong prop_start_siz;
        vm_prop_id_t max_prop;
        vm_prop_id_t min_prop;

        /* 
         *   read the record size, and calculate the value of 'siz' that
         *   we expect when we've parsed this entire record - it's the
         *   current size minus the size of the record (note that we have
         *   to add back in the two bytes of the size record itself, since
         *   'siz' will have been moved past the size record once we've
         *   read it) 
         */
        read_data(buf, 2, &siz);
        done_size = (siz + 2) - osrp2(buf);
        
        /* read the length of the entry */
        read_data(buf, 1, &siz);
        len = (uchar)buf[0];

        /* read the name and null-terminate it */
        read_data(buf, len, &siz);
        buf[len] = '\0';
        p = buf + len + 1;

        /* read the property table information */
        read_data(p, 4, &siz);
        prop_cnt = osrp2(p);
        prop_len = osrp2(p + 2);

        /* 
         *   set min and max to 'invalid' to start with, in case there are
         *   no properties at all in the table
         */
        min_prop = max_prop = VM_INVALID_PROP;

        /* 
         *   Read the properties - pass one: find the minimum and maximum
         *   property ID in the table.  Before we begin, remember where
         *   the properties start in the file, so we can go back and read
         *   the table again on the second pass.  
         */
        prop_start_ofs = fp_->get_seek();
        prop_start_siz = siz;
        for (j = 0 ; j < prop_cnt ; ++j)
        {
            vm_prop_id_t cur;
            
            /* read the next entry */
            read_data(p, 2, &siz);

            /* skip any additional data in the record */
            if (prop_len > 2)
                skip_data(prop_len - 2, &siz);

            /* get the property */
            cur = (vm_prop_id_t)osrp2(p);

            /* 
             *   if this is the first property, it's the max and min so
             *   far; otherwise, remember it if it's the highest or lowest
             *   so far 
             */
            if (j == 0)
            {
                /* this is the first one, so note it unconditionally */
                min_prop = max_prop = cur;
            }
            else
            {
                /* if it's below the current minimum, it's the new minimum */
                if (cur < min_prop)
                    min_prop = cur;

                /* if it's above the current maximum, it's the new maximum */
                if (cur > max_prop)
                    max_prop = cur;
            }
        }

        /* 
         *   Now that we know the minimum and maximum properties in the
         *   table, we can create the dependency record. 
         */
        G_meta_table->add_entry(buf, prop_cnt, min_prop, max_prop);

        /* get a pointer to my new entry */
        entry = G_meta_table->get_entry(i);

        /*
         *   Pass two: read the actual properties into the translation
         *   table.  Seek back to the start of the properties in the file,
         *   then read the ID's.
         *   
         *   Note that add_prop_xlat() expects a 1-based function table
         *   index.  We are in fact reading a function table, so run our
         *   function index counter from 1 to the entry count to yield the
         *   proper 1-based index values.  
         */
        fp_->seek(prop_start_ofs);
        siz = prop_start_siz;
        for (j = 1 ; j <= prop_cnt ; ++j)
        {
            /* read the next entry */
            read_data(p, 2, &siz);

            /* skip any additional data in the record */
            if (prop_len > 2)
                skip_data(prop_len - 2, &siz);

            /* add this entry */
            entry->add_prop_xlat((vm_prop_id_t)osrp2(p), j);
        }

        /* skip any remaining data in the record */
        if (siz > done_size)
            skip_data(siz - done_size, &siz);
    }

    /* 
     *   always add the root object metaclass to the table, whether the
     *   image file defines it or not 
     */
    G_meta_table
        ->add_entry_if_new(CVmObject::metaclass_reg_->get_reg_idx(),
                           0, VM_INVALID_PROP, VM_INVALID_PROP);
}